

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkStats.h
# Opt level: O1

void Corrade::TestSuite::Implementation::printStats
               (Debug *out,double mean,double stddev,Color color,BenchmarkUnits unit)

{
  undefined8 uVar1;
  char *unit_00;
  char *unitPrefix;
  double dVar2;
  Debug local_30 [40];
  
  switch(unit) {
  case Nanoseconds:
    dVar2 = stddev;
    if (stddev <= mean) {
      dVar2 = mean;
    }
    if (1000000000.0 <= dVar2) {
      unitPrefix = " ";
      unit_00 = "s";
      goto LAB_001121c2;
    }
    if (1000000.0 <= dVar2) {
      unitPrefix = "m";
      unit_00 = "s";
      goto LAB_0011223b;
    }
    if (dVar2 < 1000.0) {
      unitPrefix = "n";
      unit_00 = "s";
      break;
    }
    unitPrefix = anon_var_dwarf_10434;
    unit_00 = "s";
    goto LAB_0011229b;
  case Cycles:
    dVar2 = stddev;
    if (stddev <= mean) {
      dVar2 = mean;
    }
    if (1000000000.0 <= dVar2) {
      unitPrefix = "G";
      unit_00 = "C";
      goto LAB_001121c2;
    }
    if (1000000.0 <= dVar2) {
      unitPrefix = "M";
      unit_00 = "C";
      goto LAB_0011223b;
    }
    if (1000.0 <= dVar2) {
      unitPrefix = "k";
      unit_00 = "C";
      goto LAB_0011229b;
    }
    unitPrefix = " ";
    unit_00 = "C";
    break;
  case Instructions:
    dVar2 = stddev;
    if (stddev <= mean) {
      dVar2 = mean;
    }
    if (1000000000.0 <= dVar2) {
      unitPrefix = "G";
      unit_00 = "I";
      goto LAB_001121c2;
    }
    if (1000000.0 <= dVar2) {
      unitPrefix = "M";
      unit_00 = "I";
      goto LAB_0011223b;
    }
    if (1000.0 <= dVar2) {
      unitPrefix = "k";
      unit_00 = "I";
      goto LAB_0011229b;
    }
    unitPrefix = " ";
    unit_00 = "I";
    break;
  case Bytes:
    dVar2 = stddev;
    if (stddev <= mean) {
      dVar2 = mean;
    }
    if (1073741824.0 <= dVar2) {
      unitPrefix = "G";
      unit_00 = "B";
      dVar2 = 1073741824.0;
      goto LAB_001122a3;
    }
    if (1048576.0 <= dVar2) {
      unitPrefix = "M";
      unit_00 = "B";
      dVar2 = 1048576.0;
      goto LAB_001122a3;
    }
    if (1024.0 <= dVar2) {
      unitPrefix = "k";
      unit_00 = "B";
      dVar2 = 1024.0;
      goto LAB_001122a3;
    }
    unitPrefix = " ";
    unit_00 = "B";
    break;
  case Count:
    goto switchD_00111f63_caseD_68;
  case RatioThousandths:
    mean = mean / 1000.0;
    stddev = stddev / 1000.0;
    goto switchD_00111f63_caseD_68;
  case PercentageThousandths:
    mean = mean / 1000.0;
    stddev = stddev / 1000.0;
    dVar2 = stddev;
    if (stddev <= mean) {
      dVar2 = mean;
    }
    if (1000000000.0 <= dVar2) {
      unitPrefix = "G";
      unit_00 = "%";
      goto LAB_001121c2;
    }
    if (1000000.0 <= dVar2) {
      unitPrefix = "M";
      unit_00 = "%";
      goto LAB_0011223b;
    }
    if (1000.0 <= dVar2) {
      unitPrefix = "k";
      unit_00 = "%";
      goto LAB_0011229b;
    }
    unitPrefix = " ";
    unit_00 = "%";
    break;
  default:
    uVar1 = Corrade::Utility::Error::defaultOutput();
    Corrade::Utility::Error::Error((Error *)local_30,uVar1,0);
    Corrade::Utility::Debug::operator<<
              (local_30,
               "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/TestSuite/Implementation/BenchmarkStats.h:150"
              );
    Corrade::Utility::Error::~Error((Error *)local_30);
    abort();
  }
  dVar2 = 1.0;
LAB_001122a3:
  printValue(out,mean,stddev,color,dVar2,unitPrefix,unit_00);
  return;
switchD_00111f63_caseD_68:
  dVar2 = stddev;
  if (stddev <= mean) {
    dVar2 = mean;
  }
  if (1000000000.0 <= dVar2) {
    unitPrefix = "G";
    unit_00 = " ";
LAB_001121c2:
    dVar2 = 1000000000.0;
  }
  else if (1000000.0 <= dVar2) {
    unitPrefix = "M";
    unit_00 = " ";
LAB_0011223b:
    dVar2 = 1000000.0;
  }
  else if (1000.0 <= dVar2) {
    unitPrefix = "k";
    unit_00 = " ";
LAB_0011229b:
    dVar2 = 1000.0;
  }
  else {
    unit_00 = " ";
    dVar2 = 1.0;
    unitPrefix = " ";
  }
  goto LAB_001122a3;
}

Assistant:

inline void printStats(Utility::Debug& out, const double mean, const double stddev, const Utility::Debug::Color color, const Tester::BenchmarkUnits unit) {
    switch(unit) {
        case Tester::BenchmarkUnits::Nanoseconds:
            printTime(out, mean, stddev, color);
            return;
        case Tester::BenchmarkUnits::Cycles:
            printCount(out, mean, stddev, color, 1000.0, "C");
            return;
        case Tester::BenchmarkUnits::Instructions:
            printCount(out, mean, stddev, color, 1000.0, "I");
            return;
        case Tester::BenchmarkUnits::Bytes:
            printCount(out, mean, stddev, color, 1024.0, "B");
            return;
        case Tester::BenchmarkUnits::Count:
            printCount(out, mean, stddev, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::RatioThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::PercentageThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, "%");
            return;
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}